

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O3

void duckdb::WriteDataToPrimitiveSegment<unsigned_char>
               (ListSegmentFunctions *param_1,ArenaAllocator *param_2,ListSegment *segment,
               RecursiveUnifiedVectorFormat *input_data,idx_t *entry_idx)

{
  sel_t *psVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = *entry_idx;
  psVar1 = ((input_data->unified).sel)->sel_vector;
  if (psVar1 != (sel_t *)0x0) {
    uVar3 = (ulong)psVar1[uVar3];
  }
  puVar2 = (input_data->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    uVar4 = (ulong)segment->count;
    *(undefined1 *)((long)&segment[1].count + uVar4) = 0;
  }
  else {
    bVar5 = (puVar2[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0;
    uVar4 = (ulong)segment->count;
    *(bool *)((long)&segment[1].count + uVar4) = bVar5;
    if (bVar5) {
      return;
    }
  }
  *(data_t *)((long)&segment[1].count + uVar4 + segment->capacity) =
       (input_data->unified).data[uVar3];
  return;
}

Assistant:

static void WriteDataToPrimitiveSegment(const ListSegmentFunctions &, ArenaAllocator &, ListSegment *segment,
                                        RecursiveUnifiedVectorFormat &input_data, idx_t &entry_idx) {

	auto sel_entry_idx = input_data.unified.sel->get_index(entry_idx);

	// write null validity
	auto null_mask = GetNullMask(segment);
	auto valid = input_data.unified.validity.RowIsValid(sel_entry_idx);
	null_mask[segment->count] = !valid;

	// write value
	if (valid) {
		auto segment_data = GetPrimitiveData<T>(segment);
		auto input_data_ptr = UnifiedVectorFormat::GetData<T>(input_data.unified);
		Store<T>(input_data_ptr[sel_entry_idx], data_ptr_cast(segment_data + segment->count));
	}
}